

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

bool __thiscall
Clasp::Asp::SccChecker::onNode(SccChecker *this,PrgNode *n,NodeType t,Call *c,uint32 data)

{
  bool bVar1;
  uint32 uVar2;
  PrgNode *in_RCX;
  undefined4 in_EDX;
  PrgNode *in_RSI;
  NodeType in_R8D;
  Call rec;
  uint32 in_stack_ffffffffffffffd0;
  NodeType t_00;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = PrgNode::seen(in_RSI);
  if (bVar1) {
    uVar2 = PrgNode::id(in_RSI);
    if (uVar2 < *(uint *)(in_RCX + 1)) {
      uVar2 = PrgNode::id(in_RSI);
      *(uint32 *)(in_RCX + 1) = uVar2;
    }
    local_1 = false;
  }
  else {
    t_00 = in_R8D;
    bk_lib::pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>
    ::push_back((pod_vector<Clasp::Asp::SccChecker::Call,_std::allocator<Clasp::Asp::SccChecker::Call>_>
                 *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                (Call *)CONCAT44(in_R8D,*(undefined4 *)(in_RCX + 1)));
    addCall((SccChecker *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,t_00,
            in_stack_ffffffffffffffd0,in_R8D);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SccChecker::onNode(PrgNode* n, NodeType t, Call& c, uint32 data) {
	if (!n->seen()) {
		Call rec = {c.node, c.min, data};
		callStack_.push_back(rec);
		addCall(n, t, 0);
		return true;
	}
	if (n->id() < c.min) {
		c.min = n->id();
	}
	return false;
}